

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::ExternalCallEventLogEntry_ProcessArgs
               (EventLogEntry *evt,int32 rootDepth,JavascriptFunction *function,Arguments *args,
               bool checkExceptions,UnlinkableSlabAllocator *alloc)

{
  void **ppvVar1;
  Var pvVar2;
  ulong sizeInBytes;
  uint uVar3;
  
  if (evt->EventKind == ExternalCallTag) {
    evt[1].EventKind = rootDepth;
    uVar3 = (*(uint *)&args->Info & 0xffffff) + 1;
    evt[1].ResultStatus = uVar3;
    ppvVar1 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)uVar3);
    evt[1].EventTimeStamp = (int64)ppvVar1;
    *ppvVar1 = function;
    sizeInBytes = (ulong)((*(uint *)&args->Info & 0xffffff) << 3);
    js_memcpy_s((void *)(evt[1].EventTimeStamp + 8),sizeInBytes,args->Values,sizeInBytes);
    uVar3 = SUB84(args->Info,0);
    if ((uVar3 >> 0x1e & 1) == 0) {
      pvVar2 = (Var)0x0;
    }
    else {
      pvVar2 = Js::CallInfo::GetNewTarget
                         (SUB84(args->Info,3) &
                          (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                           CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                          CallFlags_New),args->Values,uVar3 & 0xffffff);
    }
    *(Var *)(evt + 2) = pvVar2;
    evt[2].EventTimeStamp = 0;
    evt[3].EventKind = ~Invalid;
    evt[3].ResultStatus = 0x7fffffff;
    *(bool *)&evt[3].EventTimeStamp = checkExceptions;
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void ExternalCallEventLogEntry_ProcessArgs(EventLogEntry* evt, int32 rootDepth, Js::JavascriptFunction* function, const Js::Arguments& args, bool checkExceptions, UnlinkableSlabAllocator& alloc)
        {
            ExternalCallEventLogEntry* callEvt = GetInlineEventDataAs<ExternalCallEventLogEntry, EventKind::ExternalCallTag>(evt);

            callEvt->RootNestingDepth = rootDepth;
            callEvt->ArgCount = args.Info.Count + 1;

            static_assert(sizeof(TTDVar) == sizeof(Js::Var), "These need to be the same size (and have same bit layout) for this to work!");

            callEvt->ArgArray = alloc.SlabAllocateArray<TTDVar>(callEvt->ArgCount);
            callEvt->ArgArray[0] = static_cast<TTDVar>(function);
            js_memcpy_s(callEvt->ArgArray + 1, args.Info.Count * sizeof(TTDVar), args.Values, args.Info.Count * sizeof(Js::Var));

            if (args.HasNewTarget())
            {
                callEvt->NewTarget = static_cast<TTDVar>(args.GetNewTarget());
            }
            else
            {
                callEvt->NewTarget = nullptr;
            }

            callEvt->ReturnValue = nullptr;
            callEvt->LastNestedEventTime = TTD_EVENT_MAXTIME;

            callEvt->CheckExceptionStatus = checkExceptions;
        }